

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O0

IOTHUB_CLIENT_RESULT
create_event_handler_callback
          (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *handleData,char *inputName,
          IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC callbackSync,
          IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC_EX callbackSyncEx,void *userContextCallback,
          void *userContextCallbackEx,size_t userContextCallbackExLength)

{
  bool bVar1;
  SINGLYLINKEDLIST_HANDLE pSVar2;
  LOGGER_LOG p_Var3;
  LIST_ITEM_HANDLE pLVar4;
  STRING_HANDLE pSVar5;
  void *pvVar6;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LIST_ITEM_HANDLE item_handle;
  IOTHUB_EVENT_CALLBACK *event_callback;
  LOGGER_LOG l;
  _Bool add_to_list;
  IOTHUB_CLIENT_RESULT result;
  void *userContextCallbackEx_local;
  void *userContextCallback_local;
  IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC_EX callbackSyncEx_local;
  IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC callbackSync_local;
  char *inputName_local;
  IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *handleData_local;
  
  bVar1 = false;
  if (handleData->event_callbacks == (SINGLYLINKEDLIST_HANDLE)0x0) {
    pSVar2 = singlylinkedlist_create();
    handleData->event_callbacks = pSVar2;
    if (pSVar2 == (SINGLYLINKEDLIST_HANDLE)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                  ,"create_event_handler_callback",0xc2b,1,
                  "Could not allocate linked list for callbacks");
      }
      return IOTHUB_CLIENT_ERROR;
    }
  }
  pLVar4 = singlylinkedlist_find(handleData->event_callbacks,is_event_equal_for_match,inputName);
  if (pLVar4 == (LIST_ITEM_HANDLE)0x0) {
    item_handle = (LIST_ITEM_HANDLE)malloc(0x28);
    if (item_handle == (LIST_ITEM_HANDLE)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                  ,"create_event_handler_callback",0xc37,1,
                  "Could not allocate IOTHUB_EVENT_CALLBACK");
      }
    }
    else {
      memset(item_handle,0,0x28);
      bVar1 = true;
    }
  }
  else {
    item_handle = (LIST_ITEM_HANDLE)singlylinkedlist_item_get_value(pLVar4);
    if ((item_handle == (LIST_ITEM_HANDLE)0x0) &&
       (p_Var3 = xlogging_get_log_function(), p_Var3 != (LOGGER_LOG)0x0)) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"create_event_handler_callback",0xc45,1,
                "singlylinkedlist_item_get_value failed looking up event callback");
    }
  }
  l._4_4_ = IOTHUB_CLIENT_ERROR;
  if (item_handle != (LIST_ITEM_HANDLE)0x0) {
    if ((inputName != (char *)0x0) && (item_handle->item == (void *)0x0)) {
      pSVar5 = STRING_construct(inputName);
      item_handle->item = pSVar5;
    }
    if ((inputName == (char *)0x0) || (item_handle->item != (void *)0x0)) {
      item_handle->next = callbackSync;
      item_handle[1].item = callbackSyncEx;
      free(item_handle[2].item);
      item_handle[2].item = (void *)0x0;
      if (userContextCallbackEx == (void *)0x0) {
        item_handle[1].next = userContextCallback;
      }
      else {
        pvVar6 = malloc(userContextCallbackExLength);
        item_handle[2].item = pvVar6;
        if (pvVar6 == (void *)0x0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                      ,"create_event_handler_callback",0xc60,1,
                      "Unable to allocate userContextCallback");
          }
          delete_event((IOTHUB_EVENT_CALLBACK *)item_handle);
          return IOTHUB_CLIENT_ERROR;
        }
      }
      if ((bVar1) &&
         (pLVar4 = singlylinkedlist_add(handleData->event_callbacks,item_handle),
         pLVar4 == (LIST_ITEM_HANDLE)0x0)) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                    ,"create_event_handler_callback",0xc66,1,"Unable to add eventCallback to list");
        }
        delete_event((IOTHUB_EVENT_CALLBACK *)item_handle);
        l._4_4_ = IOTHUB_CLIENT_ERROR;
      }
      else {
        if (userContextCallbackEx != (void *)0x0) {
          memcpy(item_handle[2].item,userContextCallbackEx,userContextCallbackExLength);
        }
        l._4_4_ = IOTHUB_CLIENT_OK;
      }
    }
    else {
      delete_event((IOTHUB_EVENT_CALLBACK *)item_handle);
      l._4_4_ = IOTHUB_CLIENT_ERROR;
    }
  }
  return l._4_4_;
}

Assistant:

static IOTHUB_CLIENT_RESULT create_event_handler_callback(IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData, const char* inputName, IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC callbackSync, IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC_EX callbackSyncEx, void* userContextCallback, void* userContextCallbackEx, size_t userContextCallbackExLength)
{
    IOTHUB_CLIENT_RESULT result = IOTHUB_CLIENT_ERROR;
    bool add_to_list = false;

    if ((handleData->event_callbacks == NULL) && ((handleData->event_callbacks = singlylinkedlist_create()) == NULL))
    {
        LogError("Could not allocate linked list for callbacks");
        result = IOTHUB_CLIENT_ERROR;
    }
    else
    {
        IOTHUB_EVENT_CALLBACK* event_callback = NULL;
        LIST_ITEM_HANDLE item_handle = singlylinkedlist_find(handleData->event_callbacks, is_event_equal_for_match, (const void*)inputName);
        if (item_handle == NULL)
        {
            event_callback = (IOTHUB_EVENT_CALLBACK*)malloc(sizeof(IOTHUB_EVENT_CALLBACK));
            if (event_callback == NULL)
            {
                LogError("Could not allocate IOTHUB_EVENT_CALLBACK");
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                memset(event_callback, 0, sizeof(*event_callback));
                add_to_list = true;
            }
        }
        else
        {
            event_callback = (IOTHUB_EVENT_CALLBACK*)singlylinkedlist_item_get_value(item_handle);
            if (event_callback == NULL)
            {
                LogError("singlylinkedlist_item_get_value failed looking up event callback");
            }
        }

        if (event_callback != NULL)
        {
            if ((inputName != NULL) && (event_callback->inputName == NULL))
            {
                event_callback->inputName = STRING_construct(inputName);
            }

            if ((inputName == NULL) || (event_callback->inputName != NULL))
            {
                event_callback->callbackAsync = callbackSync;
                event_callback->callbackAsyncEx = callbackSyncEx;

                free(event_callback->userContextCallbackEx);
                event_callback->userContextCallbackEx = NULL;

                if (userContextCallbackEx == NULL)
                {
                    event_callback->userContextCallback = userContextCallback;
                }

                if ((userContextCallbackEx != NULL) &&
                    (NULL == (event_callback->userContextCallbackEx = malloc(userContextCallbackExLength))))
                {
                    LogError("Unable to allocate userContextCallback");
                    delete_event(event_callback);
                    result = IOTHUB_CLIENT_ERROR;
                }
                else if ((add_to_list == true) && (NULL == singlylinkedlist_add(handleData->event_callbacks, event_callback)))
                {
                    LogError("Unable to add eventCallback to list");
                    delete_event(event_callback);
                    result = IOTHUB_CLIENT_ERROR;
                }
                else
                {
                    if (userContextCallbackEx != NULL)
                    {
                        memcpy(event_callback->userContextCallbackEx, userContextCallbackEx, userContextCallbackExLength);
                    }
                    result = IOTHUB_CLIENT_OK;
                }
            }
            else
            {
                delete_event(event_callback);
                result = IOTHUB_CLIENT_ERROR;
            }
        }
    }

    return result;
}